

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_exporter.cpp
# Opt level: O2

void do_export_cl_csv_pdb(Params *params)

{
  uint __line;
  pointer pvVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  DIR *__dirp;
  dirent *pdVar7;
  size_t sVar8;
  istream *piVar9;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar11;
  char *pcVar12;
  int local_35c;
  string pdb_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  confs_ls;
  vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  confs;
  _Vector_base<int,_std::allocator<int>_> local_2d0;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string line;
  Point atom;
  ofstream fls;
  int aiStack_218 [122];
  
  confs.
  super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  confs.
  super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  confs.
  super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  confs_ls.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  confs_ls.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  confs_ls.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar10 = 0x7fffffff;
  if (0 < params->export_cl_csv_pdb_max) {
    iVar10 = params->export_cl_csv_pdb_max;
  }
  __lhs = (params->export_cl_csv_pdb_in_dirs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_35c = 0;
  do {
    if (__lhs == (params->export_cl_csv_pdb_in_dirs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      if (((long)confs.
                 super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)confs.
                super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18 !=
          (long)confs_ls.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)confs_ls.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) {
        __assert_fail("confs.size() == confs_ls.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/cluster_exporter.cpp"
                      ,0x111,"void do_export_cl_csv_pdb(const Params &)");
      }
      bVar4 = anon_unknown.dwarf_11c11::write_pdbs_to_csv
                        (&confs,&params->export_cl_csv_pdb_out_path);
      if (bVar4) {
        std::ofstream::ofstream(&fls,(string *)&params->export_cl_csv_pdb_out_ls_path,_S_out);
        if (*(int *)((long)aiStack_218 + *(long *)(_fls + -0x18)) == 0) {
          for (pbVar11 = confs_ls.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pbVar11 !=
              confs_ls.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
            poVar6 = std::operator<<((ostream *)&fls,(string *)pbVar11);
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          std::ofstream::close();
          std::operator<<((ostream *)&std::cout,
                          "Full PDB to cluster CSV export finished successfully.\n");
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "Error: failed to write cluster file list at: ");
          poVar6 = std::operator<<(poVar6,(string *)&params->export_cl_csv_pdb_out_ls_path);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        std::ofstream::~ofstream(&fls);
      }
LAB_001201fa:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&confs_ls);
      std::
      vector<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
      ::~vector(&confs);
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Loading PDBs from: ");
    poVar6 = std::operator<<(poVar6,(string *)__lhs);
    std::endl<char,std::char_traits<char>>(poVar6);
    __dirp = opendir((__lhs->_M_dataplus)._M_p);
    if (__dirp == (DIR *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Error: could not open PDB directory: ");
      std::operator<<(poVar6,(string *)__lhs);
      goto LAB_001201fa;
    }
LAB_0011fc2d:
    pdVar7 = readdir(__dirp);
    if (pdVar7 != (dirent *)0x0) {
      pcVar12 = pdVar7->d_name;
      sVar8 = strlen(pcVar12);
      if ((4 < sVar8) && (iVar5 = strncmp(pcVar12 + (sVar8 - 4),".pdb",4), iVar5 == 0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fls,
                       __lhs,"/");
        std::__cxx11::string::string((string *)&local_298,pcVar12,(allocator *)&line);
        std::operator+(&pdb_path,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fls,
                       &local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&fls);
        _fls = (pointer)0x0;
        std::
        vector<std::vector<Point,std::allocator<Point>>,std::allocator<std::vector<Point,std::allocator<Point>>>>
        ::emplace_back<std::vector<Point,std::allocator<Point>>>
                  ((vector<std::vector<Point,std::allocator<Point>>,std::allocator<std::vector<Point,std::allocator<Point>>>>
                    *)&confs,(vector<Point,_std::allocator<Point>_> *)&fls);
        std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                  ((_Vector_base<Point,_std::allocator<Point>_> *)&fls);
        pvVar1 = confs.
                 super__Vector_base<std::vector<Point,_std::allocator<Point>_>,_std::allocator<std::vector<Point,_std::allocator<Point>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_2d0,&params->ends);
        if (pvVar1[-1].super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start ==
            pvVar1[-1].super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (pdb_path._M_string_length == 0) {
            pcVar12 = "!pdb_path.empty()";
            __line = 0x7b;
          }
          else if ((params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
            pcVar12 = "!starts.empty()";
            __line = 0x7c;
          }
          else {
            if (local_2d0._M_impl.super__Vector_impl_data._M_start !=
                local_2d0._M_impl.super__Vector_impl_data._M_finish) {
              bVar4 = params->export_cl_csv_pdb_bbone_only;
              bVar2 = FileExists(&pdb_path);
              if (bVar2) {
                atom.x = 0.0;
                atom.y = 0.0;
                atom.z = 0.0;
                std::ifstream::ifstream(&fls,(string *)&pdb_path,_S_in);
                line._M_dataplus._M_p = (pointer)&line.field_2;
                line._M_string_length = 0;
                line.field_2._M_local_buf[0] = '\0';
                while (piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                          ((istream *)&fls,(string *)&line),
                      ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
                  if ((line._M_string_length != 0) && (bVar3 = Pdb::is_atom_rec(&line), bVar3)) {
                    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
                    local_2b8._M_string_length = 0;
                    local_2b8.field_2._M_local_buf[0] = '\0';
                    Pdb::get_atom_rec_token(&local_2b8,&line,PdbAtomResSeqNo);
                    iVar5 = atoi(local_2b8._M_dataplus._M_p);
                    bVar3 = is_in_simulated_region
                                      (iVar5,&params->starts,
                                       (vector<int,_std::allocator<int>_> *)&local_2d0);
                    if (bVar3) {
                      if (bVar4 != false) {
                        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
                        local_298._M_string_length = 0;
                        local_298.field_2._M_local_buf[0] = '\0';
                        Pdb::get_atom_rec_token(&local_298,&line,PdbAtomName);
                        bVar3 = std::operator==(&local_298,"N");
                        if ((((bVar3) || (bVar3 = std::operator==(&local_298,"CA"), bVar3)) ||
                            (bVar3 = std::operator==(&local_298,"C"), bVar3)) ||
                           (bVar3 = std::operator==(&local_298,"O"), bVar3)) {
                          std::__cxx11::string::~string((string *)&local_298);
                        }
                        else {
                          bVar3 = std::operator==(&local_298,"CB");
                          std::__cxx11::string::~string((string *)&local_298);
                          if (!bVar3) goto LAB_0011ff2b;
                        }
                      }
                      Pdb::parse_atom_coords(&atom,&line);
                      std::vector<Point,_std::allocator<Point>_>::push_back(pvVar1 + -1,&atom);
                    }
LAB_0011ff2b:
                    std::__cxx11::string::~string((string *)&local_2b8);
                  }
                }
                std::__cxx11::string::~string((string *)&line);
                std::ifstream::close();
                std::ifstream::~ifstream(&fls);
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cout,"Warning: PDB file not found: ");
                poVar6 = std::operator<<(poVar6,(string *)&pdb_path);
                std::endl<char,std::char_traits<char>>(poVar6);
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2d0);
              if (!bVar2) {
                poVar6 = std::operator<<((ostream *)&std::cout,"Error: unable to load ");
                poVar6 = std::operator<<(poVar6,(string *)&pdb_path);
                std::operator<<(poVar6,"std::endl");
                closedir(__dirp);
                std::__cxx11::string::~string((string *)&pdb_path);
                goto LAB_001201fa;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&confs_ls,&pdb_path);
              local_35c = local_35c + 1;
              if (local_35c == iVar10) {
                std::operator<<((ostream *)&std::cout,
                                "Warning: Maximum number of conformations reached.\n");
                std::__cxx11::string::~string((string *)&pdb_path);
                local_35c = iVar10;
                goto LAB_00120053;
              }
              if (local_35c % 500 == 0) {
                poVar6 = std::operator<<((ostream *)&std::cout,"Processed file #");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_35c);
                poVar6 = std::operator<<(poVar6,": ");
                poVar6 = std::operator<<(poVar6,(string *)&pdb_path);
                std::endl<char,std::char_traits<char>>(poVar6);
              }
              std::__cxx11::string::~string((string *)&pdb_path);
              goto LAB_0011fc2d;
            }
            pcVar12 = "!ends.empty()";
            __line = 0x7d;
          }
        }
        else {
          pcVar12 = "conf.empty()";
          __line = 0x7a;
        }
        __assert_fail(pcVar12,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/cluster_exporter.cpp"
                      ,__line,
                      "bool (anonymous namespace)::load_conf(SlimStruct &, const std::string &, const std::vector<int> &, const std::vector<int>, const bool)"
                     );
      }
      goto LAB_0011fc2d;
    }
LAB_00120053:
    closedir(__dirp);
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void do_export_cl_csv_pdb(const Params &params) {

    // Store loop regions as point arrays
    std::vector<SlimStruct> confs;

    // File path to each PDB used for clustering
    std::vector<std::string> confs_ls;

    // Determine maximum number of PDBs to load
    const int MAX_CONFS = (params.export_cl_csv_pdb_max > 0)
        ? params.export_cl_csv_pdb_max : INT_MAX;

    // Load loops
    int num_confs = 0;
    for (auto idir = params.export_cl_csv_pdb_in_dirs.cbegin();
         idir != params.export_cl_csv_pdb_in_dirs.cend(); ++idir) {

        const std::string &in_dir_path = *idir;
        std::cout << "Loading PDBs from: " << in_dir_path << std::endl;

        DIR *dir;
        struct dirent *ent;
        if ((dir = opendir(in_dir_path.c_str())) != NULL) {
            // Process all PDB files in this directory
            while ((ent = readdir(dir)) != NULL) {
                
                // Skip files without .pdb extension
                if (!is_pdb_fname(ent->d_name)) {
                    continue;
                }

                // Assume input directory does end in path separator.
                // Determine path to this PDB file
                const std::string pdb_path = in_dir_path + "/" + std::string(ent->d_name);

                // Load 
                confs.push_back(SlimStruct());
                if (load_conf(
                          confs.back()
                        , pdb_path
                        , params.starts
                        , params.ends
                        , params.export_cl_csv_pdb_bbone_only)) {
                    ++num_confs;
                    confs_ls.push_back(pdb_path);
                }
                else {
                    std::cout << "Error: unable to load " << pdb_path << "std::endl";
                    closedir(dir);
                    return;
                }

                if (num_confs == MAX_CONFS) {
                    std::cout << "Warning: Maximum number of conformations reached.\n";
                    break;
                }

                // Heartbeat
                if ((num_confs % DISGRO_SMC_REPORT_INTERVAL) == 0) {
                    std::cout << "Processed file #" << num_confs << ": " << pdb_path << std::endl;
                }
            }
            closedir(dir);
        }
        else {
            std::cout << "Error: could not open PDB directory: " << in_dir_path;
            return;
        }

    } // End iteration over PDB  input directories

    assert(confs.size() == confs_ls.size());

    if (!write_pdbs_to_csv(confs, params.export_cl_csv_pdb_out_path)) {
        // Export failed"
        return;
    }

    // write ls file
    std::ofstream fls(params.export_cl_csv_pdb_out_ls_path);
    if (!fls.good()) {
        std::cout << "Error: failed to write cluster file list at: "
                  << params.export_cl_csv_pdb_out_ls_path << std::endl;
        return;
    }
    for (auto ils = confs_ls.cbegin(); ils != confs_ls.cend(); ++ils) {
        fls << *ils << std::endl;
    }
    fls.close();

    std::cout << "Full PDB to cluster CSV export finished successfully.\n";
}